

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O2

void __thiscall
nesvis::MemoryWidget::draw_mem_value
          (MemoryWidget *this,uint16_t address,optional<unsigned_char> *mem_value)

{
  ImVec2 IVar1;
  bool bVar2;
  uchar *puVar3;
  byte *pbVar4;
  ImDrawList *this_00;
  char *fmt;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  string_view fmt_00;
  format_args args;
  ImVec2 local_58 [2];
  string local_48;
  
  if ((mem_value->super__Optional_base<unsigned_char,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == true) {
    puVar3 = std::optional<unsigned_char>::value(mem_value);
    if (*puVar3 != '\0') {
      pbVar4 = std::optional<unsigned_char>::value(mem_value);
      ImGui::Text("%02hhX",(ulong)*pbVar4);
      goto LAB_00110619;
    }
    fmt = "00";
  }
  else {
    fmt = " -";
  }
  ImGui::TextDisabled(fmt);
LAB_00110619:
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    IVar5._2_6_ = 0;
    IVar5.x._0_2_ = address;
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0x6;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_58;
    local_58[0] = IVar5;
    ::fmt::v8::vformat_abi_cxx11_(&local_48,(v8 *)0x1b73b9,fmt_00,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->goto_address_input_,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    IVar1 = ImGui::GetItemRectMin();
    fVar6 = IVar1.x + -4.0;
    fVar7 = IVar1.y + -4.0;
    local_48._M_dataplus._M_p = (pointer)CONCAT44(fVar7,fVar6);
    this_00 = ImGui::GetWindowDrawList();
    local_58[0].y = fVar7 + 24.0;
    local_58[0].x = fVar6 + 24.0;
    ImDrawList::AddRectFilled(this_00,(ImVec2 *)&local_48,local_58,0x64969696,0.0,0);
    ImGui::BeginTooltip();
    ImGui::Text("%04hX",IVar5);
    ImGui::EndTooltip();
  }
  return;
}

Assistant:

void draw_mem_value(uint16_t address,
            const std::optional<uint8_t> &mem_value) {
        if (mem_value) {
            if (mem_value.value() == 0u) {
                ImGui::TextDisabled("00");
            } else {
                ImGui::Text("%02hhX", mem_value.value());
            }
        } else {
            ImGui::TextDisabled(" -");
        }

        if (ImGui::IsItemHovered()) {
            goto_address_input_ = fmt::format("{:04X}", address);

            ImVec2 pos = ImGui::GetItemRectMin();
            pos.x -= 4;
            pos.y -= 4;
            const auto color = IM_COL32(150u, 150u, 150u, 100u);
            ImGui::GetWindowDrawList()->AddRectFilled(
                    pos, ImVec2(pos.x + 24, pos.y + 24), color);

            ImGui::BeginTooltip();
            ImGui::Text("%04hX", address);
            ImGui::EndTooltip();
        }
    }